

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.hpp
# Opt level: O2

void __thiscall cppjit::builder::builder::read_and_print_log(builder *this,string *path)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  string line;
  ifstream f;
  
  std::ifstream::ifstream((string *)&f);
  std::ifstream::open((string *)&f,(_Ios_Openmode)path);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::operator<<((ostream *)&std::cerr,"could not read log file");
  }
  else {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&f,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&line);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&f);
  return;
}

Assistant:

void read_and_print_log(std::string path) {
    std::ifstream f;
    f.open(path);
    if (!f.is_open()) {
      std::cerr << "could not read log file";
      return;
    }
    std::string line;
    while (std::getline(f, line)) {
      std::cerr << line << std::endl;
    }
    f.close();
  }